

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void i386_tr_tb_stop(DisasContextBase *dcbase,CPUState *cpu)

{
  TCGContext *tcg_ctx;
  DisasContext *dc;
  
  if (dcbase->is_jmp == DISAS_TOO_MANY) {
    tcg_ctx = *(TCGContext **)(dcbase[0xc].pc_next + 0x2e8);
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_movi_i64,(long)&tcg_ctx->pool_cur + (long)dcbase[6].tb,
                       dcbase->pc_next - *(long *)&dcbase[1].max_insns);
    tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i64,(long)&tcg_ctx->pool_cur + (long)dcbase[6].tb,
                       (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x80);
    do_gen_eob_worker((DisasContext *)dcbase,false,false,false);
    return;
  }
  return;
}

Assistant:

static void i386_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    if (dc->base.is_jmp == DISAS_TOO_MANY) {
        gen_jmp_im(dc, dc->base.pc_next - dc->cs_base);
        gen_eob(dc);
    }
}